

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O3

int yaml_emitter_emit_document_start(yaml_emitter_t *emitter,yaml_event_t *event,int first)

{
  yaml_char_t yVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  yaml_version_directive_t *pyVar7;
  byte *pbVar8;
  yaml_char_t *pyVar9;
  yaml_tag_directive_t *pyVar10;
  undefined **ppuVar11;
  yaml_tag_directive_t yVar12;
  
  if (event->type == YAML_STREAM_END_EVENT) {
    iVar3 = yaml_emitter_flush(emitter);
    if (iVar3 == 0) {
      return 0;
    }
    emitter->state = YAML_EMIT_END_STATE;
    return 1;
  }
  if (event->type != YAML_DOCUMENT_START_EVENT) {
    emitter->error = YAML_EMITTER_ERROR;
    pcVar6 = "expected DOCUMENT-START or STREAM-END";
LAB_0010639c:
    emitter->problem = pcVar6;
    return 0;
  }
  pyVar7 = (event->data).document_start.version_directive;
  if ((pyVar7 != (yaml_version_directive_t *)0x0) &&
     (*pyVar7 != (yaml_version_directive_t)0x100000001)) {
    emitter->error = YAML_EMITTER_ERROR;
    pcVar6 = "incompatible %YAML directive";
    goto LAB_0010639c;
  }
  for (pyVar10 = (event->data).document_start.tag_directives.start;
      pyVar10 != (event->data).document_start.tag_directives.end; pyVar10 = pyVar10 + 1) {
    pyVar9 = pyVar10->handle;
    yVar12 = *pyVar10;
    yVar1 = *pyVar10->prefix;
    sVar5 = strlen((char *)pyVar9);
    if (sVar5 == 0) {
      pcVar6 = "tag handle must not be empty";
LAB_00106396:
      emitter->error = YAML_EMITTER_ERROR;
      goto LAB_0010639c;
    }
    if (*pyVar9 != '!') {
      pcVar6 = "tag handle must start with \'!\'";
      goto LAB_00106396;
    }
    if (pyVar9[sVar5 - 1] != '!') {
      pcVar6 = "tag handle must end with \'!\'";
      goto LAB_00106396;
    }
    if (2 < (long)sVar5) {
      pbVar8 = pyVar9 + 1;
      do {
        bVar2 = *pbVar8;
        if ((((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) &&
            (bVar2 != 0x5f)) && (bVar2 != 0x2d)) {
          pcVar6 = "tag handle must contain alphanumerical characters only";
          goto LAB_00106396;
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 < pyVar9 + (sVar5 - 1));
    }
    if (yVar1 == '\0') {
      pcVar6 = "tag prefix must not be empty";
      goto LAB_00106396;
    }
    iVar3 = yaml_emitter_append_tag_directive(emitter,yVar12,0);
    if (iVar3 == 0) {
      return 0;
    }
  }
  pyVar9 = "!";
  ppuVar11 = &PTR_anon_var_dwarf_50ca_0011ad90;
  do {
    yVar12.prefix = ppuVar11[-1];
    yVar12.handle = pyVar9;
    iVar3 = yaml_emitter_append_tag_directive(emitter,yVar12,1);
    if (iVar3 == 0) {
      return 0;
    }
    pyVar9 = *ppuVar11;
    ppuVar11 = ppuVar11 + 2;
  } while (pyVar9 != (yaml_char_t *)0x0);
  if ((first == 0) || (emitter->canonical != 0)) {
    iVar3 = 0;
  }
  else {
    iVar3 = (event->data).document_start.implicit;
  }
  pyVar7 = (event->data).document_start.version_directive;
  if ((pyVar7 == (yaml_version_directive_t *)0x0) &&
     ((event->data).document_start.tag_directives.start ==
      (event->data).document_start.tag_directives.end)) {
LAB_00106470:
    pyVar10 = (event->data).document_start.tag_directives.start;
    if (pyVar10 == (event->data).document_start.tag_directives.end) {
      if (iVar3 != 0) goto LAB_0010650e;
    }
    else {
LAB_00106487:
      do {
        iVar3 = yaml_emitter_write_indicator(emitter,"%TAG",1,0,0);
        if (iVar3 == 0) {
          return 0;
        }
        pyVar9 = pyVar10->handle;
        sVar5 = strlen((char *)pyVar9);
        iVar3 = yaml_emitter_write_tag_handle(emitter,pyVar9,sVar5);
        if (iVar3 == 0) {
          return 0;
        }
        pyVar9 = pyVar10->prefix;
        sVar5 = strlen((char *)pyVar9);
        iVar3 = yaml_emitter_write_tag_content(emitter,pyVar9,sVar5,1);
        if (iVar3 == 0) {
          return 0;
        }
        iVar3 = yaml_emitter_write_indent(emitter);
        if (iVar3 == 0) {
          return 0;
        }
        pyVar10 = pyVar10 + 1;
      } while (pyVar10 != (event->data).document_start.tag_directives.end);
    }
  }
  else {
    if (emitter->open_ended != 0) {
      iVar4 = yaml_emitter_write_indicator(emitter,"...",1,0,0);
      if (iVar4 == 0) {
        return 0;
      }
      iVar4 = yaml_emitter_write_indent(emitter);
      if (iVar4 == 0) {
        return 0;
      }
      pyVar7 = (event->data).document_start.version_directive;
    }
    if (pyVar7 == (yaml_version_directive_t *)0x0) goto LAB_00106470;
    iVar3 = yaml_emitter_write_indicator(emitter,"%YAML",1,0,0);
    if (iVar3 == 0) {
      return 0;
    }
    iVar3 = yaml_emitter_write_indicator(emitter,"1.1",1,0,0);
    if (iVar3 == 0) {
      return 0;
    }
    iVar3 = yaml_emitter_write_indent(emitter);
    if (iVar3 == 0) {
      return 0;
    }
    pyVar10 = (event->data).document_start.tag_directives.start;
    if (pyVar10 != (event->data).document_start.tag_directives.end) goto LAB_00106487;
  }
  iVar3 = yaml_emitter_write_indent(emitter);
  if (iVar3 == 0) {
    return 0;
  }
  iVar3 = yaml_emitter_write_indicator(emitter,"---",1,0,0);
  if (iVar3 == 0) {
    return 0;
  }
  if ((emitter->canonical != 0) && (iVar3 = yaml_emitter_write_indent(emitter), iVar3 == 0)) {
    return 0;
  }
LAB_0010650e:
  emitter->state = YAML_EMIT_DOCUMENT_CONTENT_STATE;
  return 1;
}

Assistant:

static int
yaml_emitter_emit_document_start(yaml_emitter_t *emitter,
        yaml_event_t *event, int first)
{
    if (event->type == YAML_DOCUMENT_START_EVENT)
    {
        yaml_tag_directive_t default_tag_directives[] = {
            {(yaml_char_t *)"!", (yaml_char_t *)"!"},
            {(yaml_char_t *)"!!", (yaml_char_t *)"tag:yaml.org,2002:"},
            {NULL, NULL}
        };
        yaml_tag_directive_t *tag_directive;
        int implicit;

        if (event->data.document_start.version_directive) {
            if (!yaml_emitter_analyze_version_directive(emitter,
                        *event->data.document_start.version_directive))
                return 0;
        }

        for (tag_directive = event->data.document_start.tag_directives.start;
                tag_directive != event->data.document_start.tag_directives.end;
                tag_directive ++) {
            if (!yaml_emitter_analyze_tag_directive(emitter, *tag_directive))
                return 0;
            if (!yaml_emitter_append_tag_directive(emitter, *tag_directive, 0))
                return 0;
        }

        for (tag_directive = default_tag_directives;
                tag_directive->handle; tag_directive ++) {
            if (!yaml_emitter_append_tag_directive(emitter, *tag_directive, 1))
                return 0;
        }

        implicit = event->data.document_start.implicit;
        if (!first || emitter->canonical) {
            implicit = 0;
        }

        if ((event->data.document_start.version_directive ||
                    (event->data.document_start.tag_directives.start
                     != event->data.document_start.tag_directives.end)) &&
                emitter->open_ended)
        {
            if (!yaml_emitter_write_indicator(emitter, "...", 1, 0, 0))
                return 0;
            if (!yaml_emitter_write_indent(emitter))
                return 0;
        }

        if (event->data.document_start.version_directive) {
            implicit = 0;
            if (!yaml_emitter_write_indicator(emitter, "%YAML", 1, 0, 0))
                return 0;
            if (!yaml_emitter_write_indicator(emitter, "1.1", 1, 0, 0))
                return 0;
            if (!yaml_emitter_write_indent(emitter))
                return 0;
        }

        if (event->data.document_start.tag_directives.start
                != event->data.document_start.tag_directives.end) {
            implicit = 0;
            for (tag_directive = event->data.document_start.tag_directives.start;
                    tag_directive != event->data.document_start.tag_directives.end;
                    tag_directive ++) {
                if (!yaml_emitter_write_indicator(emitter, "%TAG", 1, 0, 0))
                    return 0;
                if (!yaml_emitter_write_tag_handle(emitter, tag_directive->handle,
                            strlen((char *)tag_directive->handle)))
                    return 0;
                if (!yaml_emitter_write_tag_content(emitter, tag_directive->prefix,
                            strlen((char *)tag_directive->prefix), 1))
                    return 0;
                if (!yaml_emitter_write_indent(emitter))
                    return 0;
            }
        }

        if (yaml_emitter_check_empty_document(emitter)) {
            implicit = 0;
        }

        if (!implicit) {
            if (!yaml_emitter_write_indent(emitter))
                return 0;
            if (!yaml_emitter_write_indicator(emitter, "---", 1, 0, 0))
                return 0;
            if (emitter->canonical) {
                if (!yaml_emitter_write_indent(emitter))
                    return 0;
            }
        }

        emitter->state = YAML_EMIT_DOCUMENT_CONTENT_STATE;

        return 1;
    }

    else if (event->type == YAML_STREAM_END_EVENT)
    {

        if (!yaml_emitter_flush(emitter))
            return 0;

        emitter->state = YAML_EMIT_END_STATE;

        return 1;
    }

    return yaml_emitter_set_emitter_error(emitter,
            "expected DOCUMENT-START or STREAM-END");
}